

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

uint __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<unsigned_int,_unsigned_long>::call
          (Build_Function_Caller_Helper<unsigned_int,_unsigned_long> *this,Function_Params *params,
          Type_Conversions_State *t_state)

{
  uint uVar1;
  Boxed_Value local_40;
  Boxed_Number local_30;
  Type_Conversions_State *local_20;
  Type_Conversions_State *t_state_local;
  Function_Params *params_local;
  Build_Function_Caller_Helper<unsigned_int,_unsigned_long> *this_local;
  
  local_20 = t_state;
  t_state_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)this;
  dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
            ((dispatch *)&local_40,&this->m_funcs,params,t_state);
  Boxed_Number::Boxed_Number(&local_30,&local_40);
  uVar1 = Boxed_Number::get_as<unsigned_int>(&local_30);
  Boxed_Number::~Boxed_Number(&local_30);
  Boxed_Value::~Boxed_Value(&local_40);
  return uVar1;
}

Assistant:

Ret call(const chaiscript::Function_Params &params, const Type_Conversions_State &t_state) {
      if constexpr (std::is_arithmetic_v<Ret> && !std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ret>>, bool>) {
        return Boxed_Number(dispatch::dispatch(m_funcs, params, t_state)).get_as<Ret>();
      } else if constexpr (std::is_same_v<void, Ret>) {
        dispatch::dispatch(m_funcs, params, t_state);
      } else {
        return boxed_cast<Ret>(dispatch::dispatch(m_funcs, params, t_state), &t_state);
      }
    }